

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

void __thiscall LZ77Compressor::next(LZ77Compressor *this,uint8_t *input,int *i,int maxLen,int end)

{
  undefined3 uVar1;
  undefined1 uVar2;
  bool bVar3;
  int offset;
  int j;
  int iVar4;
  int matchLen;
  value_type local_34;
  int matchOff;
  
  local_34.field_1.field_1.offset = 0;
  local_34._0_4_ = 0;
  bVar3 = search(this,input,*i,maxLen,&matchOff,&matchLen);
  uVar1 = local_34._1_3_;
  uVar2 = local_34.field_1._1_1_;
  if (bVar3) {
    local_34.isRepeat = true;
    local_34._0_4_ = CONCAT31(uVar1,local_34.isRepeat);
    local_34.field_1.value = (char)matchLen + -3;
    local_34._0_4_ = CONCAT13(uVar2,local_34._0_3_);
    local_34.field_1.field_1.offset = ~(ushort)matchOff + (short)*i;
    std::vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>::push_back
              (&this->output,&local_34);
    for (iVar4 = 0; iVar4 < matchLen; iVar4 = iVar4 + 1) {
      offset = *i + iVar4;
      if (this->windowLength <= offset) {
        remove(this,(char *)input);
        offset = *i + iVar4;
      }
      if (offset < end) {
        add(this,input,offset);
      }
    }
  }
  else {
    local_34._0_2_ = local_34._1_2_ << 8;
    local_34.field_1.value = input[*i];
    std::vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>::push_back
              (&this->output,&local_34);
    iVar4 = *i;
    if (this->windowLength <= iVar4) {
      remove(this,(char *)input);
      iVar4 = *i;
    }
    add(this,input,iVar4);
    matchLen = 1;
  }
  *i = *i + matchLen;
  return;
}

Assistant:

void next(const uint8_t* input, int& i, int maxLen, int end) {
		int matchOff, matchLen;
		Item item = {0};
		if (search(input, i, maxLen, matchOff, matchLen)) {
			item.isRepeat = true;
			item.length = matchLen - 3;
			item.offset = (i - matchOff) - 1;
			output.push_back(item);
			for (int j = 0; j < matchLen; j++) {
				if (i + j >= windowLength) {
					remove(input, i + j - windowLength);
				}
				if (i + j < end) {
					add(input, i + j);
				}
			}
			i += matchLen;
		} else {
			item.isRepeat = false;
			item.value = input[i];
			output.push_back(item);
			if (i >= windowLength) {
				remove(input, i - windowLength);
			}
			add(input, i);
			i++;
		}
	}